

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall
crnlib::dynamic_string::append(dynamic_string *this,dynamic_string *other)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  bool bVar4;
  uint len_00;
  char *__src;
  uint new_total_len;
  uint len;
  dynamic_string *other_local;
  dynamic_string *this_local;
  
  uVar1 = other->m_len;
  len_00 = (uint)this->m_len + (uint)uVar1;
  if ((len_00 != 0) && (bVar4 = ensure_buf(this,len_00,true), bVar4)) {
    pcVar3 = this->m_pStr;
    uVar2 = this->m_len;
    __src = get_ptr_priv(other);
    memcpy(pcVar3 + (int)(uint)uVar2,__src,(ulong)(uVar1 + 1));
    this->m_len = this->m_len + uVar1;
    check(this);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::append(const dynamic_string& other)
    {
        uint len = other.m_len;
        uint new_total_len = m_len + len;
        if ((new_total_len) && ensure_buf(new_total_len))
        {
            memcpy(m_pStr + m_len, other.get_ptr_priv(), len + 1);
            m_len = static_cast<uint16>(m_len + len);
            check();
        }

        return *this;
    }